

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weightedlist.h
# Opt level: O1

void __thiscall TWeightedList<FDecalBase_*>::RecalcRandomVals(TWeightedList<FDecalBase_*> *this)

{
  ushort uVar1;
  Choice<FDecalBase_*> *pCVar2;
  int iVar3;
  Choice<FDecalBase_*> *pCVar4;
  double dVar5;
  
  pCVar4 = this->Choices;
  if (pCVar4 != (Choice<FDecalBase_*> *)0x0) {
    iVar3 = 0;
    for (pCVar2 = pCVar4->Next; pCVar2 != (Choice<FDecalBase_*> *)0x0; pCVar2 = pCVar2->Next) {
      iVar3 = iVar3 + (uint)pCVar4->Weight;
      pCVar4 = pCVar2;
    }
    uVar1 = pCVar4->Weight;
    pCVar4->RandomVal = 0xff;
    pCVar4 = this->Choices;
    if (pCVar4->Next != (Choice<FDecalBase_*> *)0x0) {
      dVar5 = 0.0;
      do {
        dVar5 = dVar5 + (double)pCVar4->Weight * (1.0 / (double)(int)(iVar3 + (uint)uVar1));
        pCVar4->RandomVal = (BYTE)(int)(dVar5 * 255.0);
        pCVar4 = pCVar4->Next;
      } while (pCVar4->Next != (Choice<FDecalBase_*> *)0x0);
    }
  }
  return;
}

Assistant:

void TWeightedList<T>::RecalcRandomVals ()
{
	// Redistribute the RandomVals so that they form the correct
	// distribution (as determined by the range of weights).

	int numChoices, weightSums;
	Choice<T> *choice;
	double randVal, weightDenom;

	if (Choices == NULL)
	{ // No choices, so nothing to do.
		return;
	}

	numChoices = 1;
	weightSums = 0;

	for (choice = Choices; choice->Next != NULL; choice = choice->Next)
	{
		++numChoices;
		weightSums += choice->Weight;
	}

	weightSums += choice->Weight;
	choice->RandomVal = 255;	// The last choice is always randomval 255

	randVal = 0.0;
	weightDenom = 1.0 / (double)weightSums;

	for (choice = Choices; choice->Next != NULL; choice = choice->Next)
	{
		randVal += (double)choice->Weight * weightDenom;
		choice->RandomVal = (BYTE)(randVal * 255.0);
	}
}